

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O3

Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> * __thiscall
Inferences::intersectSortedStack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
           *__return_storage_ptr__,Inferences *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *l,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *r)

{
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *pPVar1;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *pPVar2;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *pSVar8;
  ulong uVar9;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar10;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar11;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar12;
  uint uVar13;
  ulong uVar14;
  uint local_54;
  
  pMVar11 = *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)(this + 8);
  pMVar10 = *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)(this + 0x10);
  uVar7 = (long)pMVar10 - (long)pMVar11;
  pMVar12 = pMVar11;
  pSVar8 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this;
  if (pMVar10 != pMVar11) {
    pMVar12 = l->_stack;
    pMVar10 = l->_cursor;
    pSVar8 = l;
    if (pMVar10 != pMVar12) {
      pSVar8 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this;
      if ((ulong)((long)pMVar10 - (long)pMVar12) < uVar7) {
        pSVar8 = l;
      }
      uVar7 = 0;
      uVar14 = 0;
      uVar13 = 0;
      local_54 = 0;
      do {
        pMVar10 = l->_stack;
        if ((ulong)((long)l->_cursor - (long)pMVar10 >> 5) <= uVar14) break;
        if (pMVar11[uVar7].factors._id == pMVar10[uVar14].factors._id) {
          iVar6 = mpz_cmp((__mpz_struct *)(pMVar11 + uVar7),(__mpz_struct *)(pMVar10 + uVar14));
          pMVar11 = *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)(this + 8);
          if (iVar6 != 0) {
            pMVar10 = l->_stack;
            goto LAB_0048ef8f;
          }
          uVar9 = (ulong)local_54;
          local_54 = local_54 + 1;
          pMVar10 = pSVar8->_stack;
          mpz_set((__mpz_struct *)(pMVar10 + uVar9),(__mpz_struct *)(pMVar11 + uVar7));
          pPVar1 = &pMVar11[uVar7].factors;
          uVar4 = *(undefined4 *)&pPVar1->field_0x4;
          pMVar3 = pPVar1->_ptr;
          pPVar2 = &pMVar10[uVar9].factors;
          pPVar2->_id = pPVar1->_id;
          *(undefined4 *)&pPVar2->field_0x4 = uVar4;
          pPVar2->_ptr = pMVar3;
          uVar13 = uVar13 + 1;
LAB_0048efe4:
          uVar14 = (ulong)((int)uVar14 + 1);
        }
        else {
LAB_0048ef8f:
          bVar5 = Kernel::operator<(pMVar11 + uVar7,pMVar10 + uVar14);
          if (!bVar5) goto LAB_0048efe4;
          uVar13 = uVar13 + 1;
        }
        uVar7 = (ulong)uVar13;
        pMVar11 = *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)(this + 8);
      } while (uVar7 < (ulong)(*(long *)(this + 0x10) - (long)pMVar11 >> 5));
      for (pMVar11 = pSVar8->_stack + local_54; pMVar11 != pSVar8->_cursor; pMVar11 = pMVar11 + 1) {
        mpz_clear((__mpz_struct *)pMVar11);
      }
      pMVar12 = pSVar8->_stack;
      pMVar10 = pMVar12 + local_54;
    }
  }
  __return_storage_ptr__->_capacity = pSVar8->_capacity;
  pSVar8->_capacity = 0;
  __return_storage_ptr__->_cursor = pMVar10;
  pSVar8->_cursor = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  __return_storage_ptr__->_end = pSVar8->_end;
  pSVar8->_end = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  __return_storage_ptr__->_stack = pMVar12;
  pSVar8->_stack = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}